

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O2

int __thiscall ncnn::LSTM::forward(LSTM *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  void *__dest;
  int _h;
  void *__src;
  Mat top_blob_reverse;
  Mat top_blob_forward;
  Mat local_f0;
  Mat local_b0;
  Mat local_70;
  
  _h = bottom_blob->h;
  Mat::create(top_blob,this->num_output << (this->direction == 2),_h,4,opt->blob_allocator);
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  iVar1 = this->direction;
  iVar4 = 1;
  if (iVar1 == 0) {
    top_blob_forward.w = (this->weight_xc_data).w;
    top_blob_forward.h = (this->weight_xc_data).h;
    top_blob_forward.data = (this->weight_xc_data).data;
    top_blob_forward.elemsize = (this->weight_xc_data).elemsize;
    top_blob_forward.elempack = (this->weight_xc_data).elempack;
    top_blob_forward.allocator = (this->weight_xc_data).allocator;
    top_blob_forward.refcount = (int *)0x0;
    top_blob_reverse.dims = 2;
    top_blob_forward.cstep = (size_t)(top_blob_forward.h * top_blob_forward.w);
    top_blob_reverse.w = (this->bias_c_data).w;
    top_blob_reverse.h = (this->bias_c_data).h;
    top_blob_reverse.data = (this->bias_c_data).data;
    top_blob_reverse.elemsize = (this->bias_c_data).elemsize;
    top_blob_reverse.elempack = (this->bias_c_data).elempack;
    top_blob_reverse.allocator = (this->bias_c_data).allocator;
    top_blob_reverse.refcount = (int *)0x0;
    top_blob_reverse.cstep = (size_t)(top_blob_reverse.h * top_blob_reverse.w);
    local_f0.w = (this->weight_hc_data).w;
    local_f0.h = (this->weight_hc_data).h;
    local_f0.data = (this->weight_hc_data).data;
    local_f0.elemsize = (this->weight_hc_data).elemsize;
    local_f0.elempack = (this->weight_hc_data).elempack;
    local_f0.allocator = (this->weight_hc_data).allocator;
    local_f0.refcount = (int *)0x0;
    local_f0.dims = 2;
    local_f0.cstep = (size_t)(local_f0.h * local_f0.w);
    top_blob_reverse.c = iVar4;
    top_blob_forward.dims = top_blob_reverse.dims;
    top_blob_forward.c = iVar4;
    local_f0.c = iVar4;
    iVar1 = lstm(bottom_blob,top_blob,0,&top_blob_forward,&top_blob_reverse,&local_f0,opt);
    Mat::~Mat(&local_f0);
    Mat::~Mat(&top_blob_reverse);
    Mat::~Mat(&top_blob_forward);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = this->direction;
  }
  iVar4 = 1;
  if (iVar1 == 1) {
    top_blob_forward.w = (this->weight_xc_data).w;
    top_blob_forward.h = (this->weight_xc_data).h;
    top_blob_forward.data = (this->weight_xc_data).data;
    top_blob_forward.elemsize = (this->weight_xc_data).elemsize;
    top_blob_forward.elempack = (this->weight_xc_data).elempack;
    top_blob_forward.allocator = (this->weight_xc_data).allocator;
    top_blob_forward.refcount = (int *)0x0;
    top_blob_reverse.dims = 2;
    top_blob_forward.cstep = (size_t)(top_blob_forward.h * top_blob_forward.w);
    top_blob_reverse.w = (this->bias_c_data).w;
    top_blob_reverse.h = (this->bias_c_data).h;
    top_blob_reverse.data = (this->bias_c_data).data;
    top_blob_reverse.elemsize = (this->bias_c_data).elemsize;
    top_blob_reverse.elempack = (this->bias_c_data).elempack;
    top_blob_reverse.allocator = (this->bias_c_data).allocator;
    top_blob_reverse.refcount = (int *)0x0;
    top_blob_reverse.cstep = (size_t)(top_blob_reverse.h * top_blob_reverse.w);
    local_f0.w = (this->weight_hc_data).w;
    local_f0.h = (this->weight_hc_data).h;
    local_f0.data = (this->weight_hc_data).data;
    local_f0.elemsize = (this->weight_hc_data).elemsize;
    local_f0.elempack = (this->weight_hc_data).elempack;
    local_f0.allocator = (this->weight_hc_data).allocator;
    local_f0.refcount = (int *)0x0;
    local_f0.dims = 2;
    local_f0.cstep = (size_t)(local_f0.h * local_f0.w);
    top_blob_reverse.c = iVar4;
    top_blob_forward.dims = top_blob_reverse.dims;
    top_blob_forward.c = iVar4;
    local_f0.c = iVar4;
    iVar1 = lstm(bottom_blob,top_blob,1,&top_blob_forward,&top_blob_reverse,&local_f0,opt);
    Mat::~Mat(&local_f0);
    Mat::~Mat(&top_blob_reverse);
    Mat::~Mat(&top_blob_forward);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = this->direction;
  }
  if (iVar1 != 2) {
    return 0;
  }
  Mat::Mat(&top_blob_forward,this->num_output,_h,4,opt->workspace_allocator);
  iVar1 = -100;
  if ((top_blob_forward.data == (void *)0x0) ||
     ((long)top_blob_forward.c * top_blob_forward.cstep == 0)) {
    cVar3 = '\0';
    goto LAB_00143fa5;
  }
  Mat::Mat(&top_blob_reverse,this->num_output,_h,4,opt->workspace_allocator);
  iVar1 = -100;
  if ((top_blob_reverse.data == (void *)0x0) ||
     ((long)top_blob_reverse.c * top_blob_reverse.cstep == 0)) {
LAB_00143e26:
    iVar4 = 0;
  }
  else {
    local_f0.w = (this->weight_xc_data).w;
    local_f0.h = (this->weight_xc_data).h;
    local_f0.data = (this->weight_xc_data).data;
    local_f0.elemsize = (this->weight_xc_data).elemsize;
    local_f0.elempack = (this->weight_xc_data).elempack;
    local_f0.allocator = (this->weight_xc_data).allocator;
    local_f0.refcount = (int *)0x0;
    local_f0.dims = 2;
    local_f0.c = 1;
    local_f0.cstep = (size_t)(local_f0.h * local_f0.w);
    local_70.w = (this->bias_c_data).w;
    local_70.h = (this->bias_c_data).h;
    local_70.data = (this->bias_c_data).data;
    local_70.elemsize = (this->bias_c_data).elemsize;
    local_70.elempack = (this->bias_c_data).elempack;
    local_70.allocator = (this->bias_c_data).allocator;
    local_70.refcount = (int *)0x0;
    local_70.cstep = (size_t)(local_70.h * local_70.w);
    local_b0.w = (this->weight_hc_data).w;
    local_b0.h = (this->weight_hc_data).h;
    local_b0.data = (this->weight_hc_data).data;
    local_b0.elemsize = (this->weight_hc_data).elemsize;
    local_b0.elempack = (this->weight_hc_data).elempack;
    local_b0.allocator = (this->weight_hc_data).allocator;
    local_b0.refcount = (int *)0x0;
    local_b0.cstep = (size_t)(local_b0.h * local_b0.w);
    local_b0.dims = local_f0.dims;
    local_b0.c = local_f0.c;
    local_70.dims = local_f0.dims;
    local_70.c = local_f0.c;
    iVar1 = lstm(bottom_blob,&top_blob_forward,0,&local_f0,&local_70,&local_b0,opt);
    Mat::~Mat(&local_b0);
    Mat::~Mat(&local_70);
    Mat::~Mat(&local_f0);
    if (iVar1 != 0) goto LAB_00143e26;
    Mat::channel(&local_f0,&this->weight_xc_data,1);
    Mat::channel(&local_70,&this->bias_c_data,1);
    Mat::channel(&local_b0,&this->weight_hc_data,1);
    iVar1 = lstm(bottom_blob,&top_blob_reverse,1,&local_f0,&local_70,&local_b0,opt);
    Mat::~Mat(&local_b0);
    Mat::~Mat(&local_70);
    Mat::~Mat(&local_f0);
    iVar4 = 0;
    if (iVar1 == 0) {
      if (_h < 1) {
        _h = iVar4;
      }
      for (; _h != iVar4; iVar4 = iVar4 + 1) {
        lVar2 = (long)iVar4;
        __src = (void *)(top_blob_reverse.w * lVar2 * top_blob_reverse.elemsize +
                        (long)top_blob_reverse.data);
        __dest = (void *)(top_blob->w * lVar2 * top_blob->elemsize + (long)top_blob->data);
        memcpy(__dest,(void *)(top_blob_forward.w * lVar2 * top_blob_forward.elemsize +
                              (long)top_blob_forward.data),(long)this->num_output << 2);
        memcpy((void *)((long)__dest + (long)this->num_output * 4),__src,(long)this->num_output << 2
              );
      }
      iVar1 = 0;
      iVar4 = 1;
    }
  }
  cVar3 = (char)iVar4;
  Mat::~Mat(&top_blob_reverse);
LAB_00143fa5:
  Mat::~Mat(&top_blob_forward);
  if (cVar3 != '\0') {
    return 0;
  }
  return iVar1;
}

Assistant:

int LSTM::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int T = bottom_blob.h;

    int num_directions = direction == 2 ? 2 : 1;

    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // forward
    if (direction == 0)
    {
        int ret = lstm(bottom_blob, top_blob, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 1)
    {
        int ret = lstm(bottom_blob, top_blob, 1, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        int ret0 = lstm(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), opt);
        if (ret0 != 0)
            return ret0;

        int ret1 = lstm(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), opt);
        if (ret1 != 0)
            return ret1;

        // concat w
        for (int i=0; i<T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    return 0;
}